

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O0

void __thiscall ScalableKReach::PartialIndex::update_cover(PartialIndex *this,vertex_t v)

{
  degree_t dVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  reference pvVar4;
  uint local_18;
  vertex_t local_14;
  vertex_t j;
  vertex_t v_local;
  PartialIndex *this_local;
  
  local_18 = 0;
  local_14 = v;
  _j = this;
  do {
    dVar1 = Graph::num_vertices(this->graph_);
    if (dVar1 <= local_18) {
      return;
    }
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::at(&this->succ_,&local_14);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(pmVar2,(ulong)local_18);
    if (*pvVar3 == '?') {
      pmVar2 = std::
               unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::at(&this->pred_,&local_14);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (pmVar2,(ulong)local_18);
      if (*pvVar3 != '?') goto LAB_0011422a;
    }
    else {
LAB_0011422a:
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (this->degree_,(ulong)local_18);
      if (*pvVar4 != 0) {
        cover(this,local_18);
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void ScalableKReach::PartialIndex::update_cover(vertex_t v) {
    for (vertex_t j = 0; j < graph_.num_vertices(); ++j) {
        if ((succ_.at(v).at(j) != INF8 || pred_.at(v).at(j) != INF8) &&
            degree_.at(j) > 0) {
            cover(j);
        }
    }
}